

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O3

void __thiscall
Hand::getFingers(Hand *this,vector<ShortFinger,_std::allocator<ShortFinger>_> *lastFingers)

{
  Point *pPVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pVVar7;
  pointer pFVar8;
  pointer pFVar9;
  undefined4 uVar10;
  Point PVar11;
  Point PVar12;
  Point PVar13;
  Point PVar14;
  Point PVar15;
  Point PVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  size_type __new_size;
  pointer *ppSVar20;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> __i;
  pointer pFVar21;
  pointer pFVar22;
  Vec4i *v;
  pointer defect;
  pointer pFVar23;
  Point PVar24;
  double dVar25;
  undefined1 auVar26 [16];
  _InputArray local_c8;
  pointer *local_b0;
  Finger f;
  _OutputArray local_48;
  
  if ((this->contour).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (this->contour).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    this->ok = false;
  }
  else {
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    f.ptEnd = (Point)this;
    local_c8.obj = &this->hull;
    local_c8.sz.width = 0;
    local_c8.sz.height = 0;
    local_c8.flags = -0x7dfcfff4;
    local_b0 = (pointer *)lastFingers;
    cv::convexHull((_InputArray *)&f,(_OutputArray *)&local_c8,false,true);
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_c8.sz.width = 0;
    local_c8.sz.height = 0;
    local_c8.flags = -0x7dfcfffc;
    local_c8.obj = &this->hullI;
    cv::convexHull((_InputArray *)&f,(_OutputArray *)&local_c8,false,true);
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_c8.sz.width = 0;
    local_c8.sz.height = 0;
    local_c8.flags = -0x7efcfffc;
    local_48.super__InputArray.obj = &this->defects;
    local_48.super__InputArray.sz.width = 0;
    local_48.super__InputArray.sz.height = 0;
    local_48.super__InputArray.flags = -0x7dfcffe4;
    local_c8.obj = &this->hullI;
    cv::convexityDefects((_InputArray *)&f,&local_c8,&local_48);
    defect = (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar7 = (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (defect != pVVar7) {
      do {
        Finger::Finger(&f,defect,&this->contour,&this->border,this->maxAngle,this->shouldCheckAngles
                       ,true,-1);
        if (f.ok == true) {
          std::vector<Finger,_std::allocator<Finger>_>::push_back(&this->fingers,&f);
        }
        defect = defect + 1;
      } while (defect != pVVar7);
    }
    pFVar23 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar8 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar23 != pFVar8) {
      uVar17 = (long)pFVar8 - (long)pFVar23 >> 6;
      lVar18 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                (pFVar23,pFVar8,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pFVar8 - (long)pFVar23 < 0x401) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                  (pFVar23,pFVar8);
      }
      else {
        pFVar21 = pFVar23 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                  (pFVar23,pFVar21);
        for (; pFVar21 != pFVar8; pFVar21 = pFVar21 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Val_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                    (pFVar21);
        }
      }
    }
    removeCloseFingertips(this);
    uVar3 = this->area;
    auVar26._8_4_ = (int)uVar3;
    auVar26._0_8_ = uVar3;
    auVar26._12_4_ = (int)((ulong)uVar3 >> 0x20);
    auVar26 = divpd(*(undefined1 (*) [16])&this->field_0x90,auVar26);
    PVar24.x = (int)auVar26._0_8_;
    PVar24.y = (int)auVar26._8_8_;
    this->center = PVar24;
    getFingersIndexes(this,(vector<ShortFinger,_std::allocator<ShortFinger>_> *)local_b0);
    iVar19 = this->maxFingers;
    __new_size = (size_type)iVar19;
    if (__new_size != 0xffffffffffffffff) {
      if (__new_size <
          (ulong)((long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6)) {
        std::vector<Finger,_std::allocator<Finger>_>::resize(&this->fingers,__new_size);
        iVar19 = this->maxFingers;
      }
      if ((iVar19 != -1 & this->shouldGetLast) == 1) {
        pFVar23 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar8 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar18 = (long)pFVar8 - (long)pFVar23;
        if ((ulong)(lVar18 >> 6) < (ulong)(long)iVar19 && lVar18 != 0) {
          do {
            pFVar21 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pFVar9 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            ppSVar20 = (pointer *)((long)pFVar9 - (long)pFVar21);
            if (((long)this->maxFingers != 0xffffffffffffffff) &&
               ((ulong)(long)this->maxFingers <= (ulong)((long)ppSVar20 >> 6))) {
              return;
            }
            pPVar1 = &pFVar23->ptEnd;
            PVar16 = *pPVar1;
            PVar15 = *pPVar1;
            PVar14 = *pPVar1;
            PVar13 = *pPVar1;
            PVar12 = *pPVar1;
            PVar11 = *pPVar1;
            PVar24 = *pPVar1;
            if (0 < (long)ppSVar20 >> 8) {
              lVar18 = ((long)ppSVar20 >> 8) + 1;
              pFVar21 = pFVar21 + 2;
              do {
                pFVar22 = pFVar21;
                local_c8._0_8_ = pFVar22[-2].ptStart;
                f.ptStart = PVar24;
                local_b0 = ppSVar20;
                dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
                if (dVar25 <= 50.0) {
                  pFVar22 = pFVar22 + -2;
                  goto LAB_00105c51;
                }
                local_c8._0_8_ = pFVar22[-1].ptStart;
                f.ptStart = PVar11;
                dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
                if (dVar25 <= 50.0) {
                  pFVar22 = pFVar22 + -1;
                  goto LAB_00105c51;
                }
                local_c8._0_8_ = pFVar22->ptStart;
                f.ptStart = PVar12;
                dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
                if (dVar25 <= 50.0) goto LAB_00105c51;
                local_c8._0_8_ = pFVar22[1].ptStart;
                f.ptStart = PVar13;
                dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
                if (dVar25 <= 50.0) {
                  pFVar22 = pFVar22 + 1;
                  goto LAB_00105c51;
                }
                lVar18 = lVar18 + -1;
                ppSVar20 = local_b0 + -0x20;
                pFVar21 = pFVar22 + 4;
              } while (1 < lVar18);
              pFVar21 = pFVar22 + 2;
            }
            lVar18 = (long)ppSVar20 >> 6;
            if (lVar18 == 1) {
LAB_00105c10:
              local_c8._0_8_ = pFVar21->ptStart;
              f.ptStart = PVar16;
              dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
              pFVar22 = pFVar21;
              if (50.0 < dVar25) {
                pFVar22 = pFVar9;
              }
            }
            else if (lVar18 == 2) {
LAB_00105bd2:
              local_c8._0_8_ = pFVar21->ptStart;
              f.ptStart = PVar15;
              dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
              pFVar22 = pFVar21;
              if (50.0 < dVar25) {
                pFVar21 = pFVar21 + 1;
                goto LAB_00105c10;
              }
            }
            else {
              pFVar22 = pFVar9;
              if (lVar18 == 3) {
                local_c8._0_8_ = pFVar21->ptStart;
                f.ptStart = PVar14;
                dVar25 = getDist(&f.ptStart,(Point *)&local_c8);
                pFVar22 = pFVar21;
                if (50.0 < dVar25) {
                  pFVar21 = pFVar21 + 1;
                  goto LAB_00105bd2;
                }
              }
            }
LAB_00105c51:
            if (pFVar22 ==
                (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar2 = (pFVar23->ptStart).x;
              uVar4 = (pFVar23->ptStart).y;
              uVar5 = (pFVar23->ptEnd).x;
              uVar6 = (pFVar23->ptEnd).y;
              f.ptStart.y = uVar6;
              f.ptStart.x = uVar5;
              f.ptFar = pFVar23->ptFar;
              uVar10 = pFVar23->hndAngle;
              f.depth = pFVar23->depth;
              f.maxAngle = pFVar23->maxAngle;
              f.minDepth = pFVar23->minDepth;
              f.ok = pFVar23->ok;
              f.shouldCheckAngles = pFVar23->shouldCheckAngles;
              f.shouldCheckDist = pFVar23->shouldCheckDist;
              f._39_1_ = pFVar23->field_0x27;
              f.boundingBox.x = (pFVar23->boundingBox).x;
              f.boundingBox.y = (pFVar23->boundingBox).y;
              f.boundingBox.width = (pFVar23->boundingBox).width;
              f.boundingBox.height = (pFVar23->boundingBox).height;
              f.ptEnd.x = uVar2;
              f.ptEnd.y = uVar4;
              f.hndAngle = uVar10;
              f.index = -1;
              std::vector<Finger,std::allocator<Finger>>::emplace_back<Finger&>
                        ((vector<Finger,std::allocator<Finger>> *)&this->fingers,&f);
            }
            pFVar23 = pFVar23 + 1;
          } while (pFVar23 != pFVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void Hand::getFingers(const vector<ShortFinger> &lastFingers) {
    if (contour.empty()) {
        ok = false;
        return;
    }
    convexHull(contour, hull, false);
    convexHull(contour, hullI, false);
    convexityDefects(contour, hullI, defects);

    for (const Vec4i &v : defects) {
        Finger f(v, contour, border, maxAngle, shouldCheckAngles);
        if (f.ok)
            fingers.push_back(f);
    }
    sort(fingers.begin(), fingers.end(), [](const Finger &a, const Finger &b) {
        return a.ptStart.y < b.ptStart.y;
    });
    removeCloseFingertips();
    getCenter();
    getFingersIndexes(lastFingers);
    if (maxFingers != -1 && fingers.size() > maxFingers)
        fingers.resize(maxFingers);

    if (shouldGetLast) {
        if (maxFingers != -1 && fingers.size() < maxFingers) {
            for (const Finger &f : fingers) {
                if (maxFingers != -1 && fingers.size() >= maxFingers)
                    break;
                auto fnd = find_if(fingers.begin(), fingers.end(), [f](const Finger &b) {
                    return getDist(f.ptEnd, b.ptStart) <= 50;
                });
                if (fnd != fingers.end())
                    continue;

                Finger nf = f;
                nf.ptStart = f.ptEnd;
                nf.ptEnd = f.ptStart;
                nf.index = -1;
                fingers.emplace_back(nf);
            }
        }
    }
}